

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef __thiscall llvm::sys::path::extension(path *this,StringRef path,Style style)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  StringRef SVar5;
  StringRef RHS;
  StringRef RHS_00;
  StringRef path_00;
  StringRef LHS;
  StringRef LHS_00;
  undefined1 local_20 [8];
  StringRef fname;
  
  path_00.Length = path.Data;
  path_00.Data = (char *)this;
  _local_20 = filename(path_00,(Style)path.Length);
  pcVar2 = (char *)StringRef::rfind((StringRef *)local_20,'.',0xffffffffffffffff);
  if (pcVar2 == (char *)0xffffffffffffffff) {
    sVar4 = 0;
    pcVar3 = (char *)0x0;
  }
  else {
    if (fname.Data == (char *)0x1) {
      RHS.Length = 1;
      RHS.Data = ".";
      LHS.Length = 1;
      LHS.Data = (char *)local_20;
      bVar1 = llvm::operator==(LHS,RHS);
      sVar4 = 0;
      pcVar3 = (char *)0x0;
      if (bVar1) goto LAB_00b64a54;
    }
    if (fname.Data == (char *)0x2) {
      RHS_00.Length = 2;
      RHS_00.Data = "..";
      LHS_00.Length = 2;
      LHS_00.Data = (char *)local_20;
      bVar1 = llvm::operator==(LHS_00,RHS_00);
      sVar4 = 0;
      pcVar3 = (char *)0x0;
      if (bVar1) goto LAB_00b64a54;
    }
    if (fname.Data < pcVar2) {
      pcVar2 = fname.Data;
    }
    sVar4 = (long)fname.Data - (long)pcVar2;
    pcVar3 = pcVar2 + (long)local_20;
  }
LAB_00b64a54:
  SVar5.Length = sVar4;
  SVar5.Data = pcVar3;
  return SVar5;
}

Assistant:

StringRef extension(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return StringRef();
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return StringRef();
    else
      return fname.substr(pos);
}